

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O3

void __thiscall duckdb::PragmaUserAgentData::~PragmaUserAgentData(PragmaUserAgentData *this)

{
  pointer pcVar1;
  
  (this->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__PragmaUserAgentData_0245a230;
  pcVar1 = (this->user_agent)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->user_agent).field_2) {
    operator_delete(pcVar1);
  }
  GlobalTableFunctionState::~GlobalTableFunctionState(&this->super_GlobalTableFunctionState);
  operator_delete(this);
  return;
}

Assistant:

PragmaUserAgentData() : finished(false) {
	}